

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitfromevents.cpp
# Opt level: O1

void __thiscall
YAML::EmitFromEvents::OnMapStart
          (EmitFromEvents *this,Mark *param_1,string *tag,anchor_t anchor,value style)

{
  _Elt_pointer pvVar1;
  EMITTER_MANIP value;
  value local_24;
  
  BeginNode(this);
  EmitProps(this,tag,anchor);
  if (style == Block) {
    value = Block;
  }
  else {
    if (style != Flow) goto LAB_00713e89;
    value = Flow;
  }
  Emitter::SetLocalValue(this->m_emitter,value);
LAB_00713e89:
  Emitter::RestoreGlobalModifiedSettings(this->m_emitter);
  Emitter::SetLocalValue(this->m_emitter,BeginMap);
  pvVar1 = (this->m_stateStack).c.
           super__Deque_base<YAML::EmitFromEvents::State::value,_std::allocator<YAML::EmitFromEvents::State::value>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pvVar1 == (this->m_stateStack).c.
                super__Deque_base<YAML::EmitFromEvents::State::value,_std::allocator<YAML::EmitFromEvents::State::value>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::
    deque<YAML::EmitFromEvents::State::value,_std::allocator<YAML::EmitFromEvents::State::value>_>::
    _M_push_back_aux<YAML::EmitFromEvents::State::value>(&(this->m_stateStack).c,&local_24);
  }
  else {
    *pvVar1 = WaitingForKey;
    (this->m_stateStack).c.
    super__Deque_base<YAML::EmitFromEvents::State::value,_std::allocator<YAML::EmitFromEvents::State::value>_>
    ._M_impl.super__Deque_impl_data._M_finish._M_cur = pvVar1 + 1;
  }
  return;
}

Assistant:

void EmitFromEvents::OnMapStart(const Mark&, const std::string& tag,
                                anchor_t anchor, EmitterStyle::value style) {
  BeginNode();
  EmitProps(tag, anchor);
  switch (style) {
    case EmitterStyle::Block:
      m_emitter << Block;
      break;
    case EmitterStyle::Flow:
      m_emitter << Flow;
      break;
    default:
      break;
  }
  // Restore the global settings to eliminate the override from node style
  m_emitter.RestoreGlobalModifiedSettings();
  m_emitter << BeginMap;
  m_stateStack.push(State::WaitingForKey);
}